

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  
  fVar12 = scale * r_scale0;
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar26 = sVar8 * uVar5;
  lVar30 = sVar8 * (uVar5 + 1);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar28 = uVar5 * sVar8;
  lVar29 = sVar8 * (uVar5 + 1);
  auVar70 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar26),(undefined1  [16])ofs->field_0);
  auVar42._0_4_ = scale * auVar70._0_4_;
  auVar42._4_4_ = scale * auVar70._4_4_;
  auVar42._8_4_ = scale * auVar70._8_4_;
  auVar42._12_4_ = scale * auVar70._12_4_;
  auVar40._4_4_ = auVar42._0_4_;
  auVar40._0_4_ = auVar42._0_4_;
  auVar40._8_4_ = auVar42._0_4_;
  auVar40._12_4_ = auVar42._0_4_;
  auVar70 = vshufps_avx(auVar42,auVar42,0x55);
  aVar3 = (space->vx).field_0;
  aVar4 = (space->vy).field_0;
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar21 = (space->vz).field_0.m128[0];
  fVar22 = (space->vz).field_0.m128[1];
  fVar23 = (space->vz).field_0.m128[2];
  fVar24 = (space->vz).field_0.m128[3];
  auVar37._0_4_ = fVar21 * auVar42._0_4_;
  auVar37._4_4_ = fVar22 * auVar42._4_4_;
  auVar37._8_4_ = fVar23 * auVar42._8_4_;
  auVar37._12_4_ = fVar24 * auVar42._12_4_;
  auVar70 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar70);
  auVar37 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar3,auVar40);
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar13 = fVar12 * fVar2 * *(float *)(pcVar7 + lVar26 + 0xc);
  auVar70 = vinsertps_avx(auVar37,ZEXT416((uint)fVar13),0x30);
  auVar42 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar30),(undefined1  [16])ofs->field_0);
  auVar38._0_4_ = scale * auVar42._0_4_;
  auVar38._4_4_ = scale * auVar42._4_4_;
  auVar38._8_4_ = scale * auVar42._8_4_;
  auVar38._12_4_ = scale * auVar42._12_4_;
  auVar41._4_4_ = auVar38._0_4_;
  auVar41._0_4_ = auVar38._0_4_;
  auVar41._8_4_ = auVar38._0_4_;
  auVar41._12_4_ = auVar38._0_4_;
  auVar42 = vshufps_avx(auVar38,auVar38,0x55);
  auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar36._0_4_ = fVar21 * auVar38._0_4_;
  auVar36._4_4_ = fVar22 * auVar38._4_4_;
  auVar36._8_4_ = fVar23 * auVar38._8_4_;
  auVar36._12_4_ = fVar24 * auVar38._12_4_;
  auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar42);
  auVar36 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar41);
  fVar14 = fVar12 * fVar2 * *(float *)(pcVar7 + lVar30 + 0xc);
  auVar42 = vinsertps_avx(auVar36,ZEXT416((uint)fVar14),0x30);
  pfVar1 = (float *)(pcVar9 + lVar28);
  auVar39._0_4_ = scale * *pfVar1;
  auVar39._4_4_ = scale * pfVar1[1];
  auVar39._8_4_ = scale * pfVar1[2];
  auVar39._12_4_ = scale * pfVar1[3];
  auVar80._4_4_ = auVar39._0_4_;
  auVar80._0_4_ = auVar39._0_4_;
  auVar80._8_4_ = auVar39._0_4_;
  auVar80._12_4_ = auVar39._0_4_;
  auVar38 = vshufps_avx(auVar39,auVar39,0x55);
  auVar40 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar31._0_4_ = fVar21 * auVar40._0_4_;
  auVar31._4_4_ = fVar22 * auVar40._4_4_;
  auVar31._8_4_ = fVar23 * auVar40._8_4_;
  auVar31._12_4_ = fVar24 * auVar40._12_4_;
  auVar38 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar4,auVar38);
  auVar38 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar80);
  auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar2 * *(float *)(pcVar9 + lVar28 + 0xc) * fVar12)
                                         ),0x30);
  pfVar1 = (float *)(pcVar9 + lVar29);
  auVar32._0_4_ = scale * *pfVar1;
  auVar32._4_4_ = scale * pfVar1[1];
  auVar32._8_4_ = scale * pfVar1[2];
  auVar32._12_4_ = scale * pfVar1[3];
  auVar35._4_4_ = auVar32._0_4_;
  auVar35._0_4_ = auVar32._0_4_;
  auVar35._8_4_ = auVar32._0_4_;
  auVar35._12_4_ = auVar32._0_4_;
  auVar40 = vshufps_avx(auVar32,auVar32,0x55);
  auVar41 = vshufps_avx(auVar32,auVar32,0xaa);
  auVar33._0_4_ = fVar21 * auVar41._0_4_;
  auVar33._4_4_ = fVar22 * auVar41._4_4_;
  auVar33._8_4_ = fVar23 * auVar41._8_4_;
  auVar33._12_4_ = fVar24 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar4,auVar40);
  auVar40 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar35);
  auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)(fVar12 * fVar2 * *(float *)(pcVar9 + lVar29 + 0xc))
                                         ),0x30);
  auVar34._8_4_ = 0xbeaaaaab;
  auVar34._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar34._12_4_ = 0xbeaaaaab;
  auVar38 = vfnmadd213ps_fma(auVar38,auVar34,auVar70);
  auVar70 = vfmadd213ps_fma(auVar40,auVar34,auVar42);
  uVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar25 = (ulong)uVar5;
  uVar71 = auVar37._0_4_;
  uVar79 = auVar38._0_4_;
  if (uVar25 == 4) {
    auVar76._4_4_ = uVar71;
    auVar76._0_4_ = uVar71;
    auVar76._8_4_ = uVar71;
    auVar76._12_4_ = uVar71;
    auVar40 = vshufps_avx(auVar37,auVar37,0x55);
    auVar41 = vshufps_avx(auVar37,auVar37,0xaa);
    auVar78._4_4_ = fVar13;
    auVar78._0_4_ = fVar13;
    auVar78._8_4_ = fVar13;
    auVar78._12_4_ = fVar13;
    auVar82._4_4_ = uVar79;
    auVar82._0_4_ = uVar79;
    auVar82._8_4_ = uVar79;
    auVar82._12_4_ = uVar79;
    auVar37 = vshufps_avx(auVar38,auVar38,0x55);
    auVar39 = vshufps_avx(auVar38,auVar38,0xaa);
    auVar38 = vshufps_avx(auVar38,auVar38,0xff);
    uVar71 = auVar70._0_4_;
    auVar85._4_4_ = uVar71;
    auVar85._0_4_ = uVar71;
    auVar85._8_4_ = uVar71;
    auVar85._12_4_ = uVar71;
    auVar31 = vshufps_avx512vl(auVar70,auVar70,0x55);
    auVar32 = vshufps_avx512vl(auVar70,auVar70,0xaa);
    auVar70 = vshufps_avx(auVar70,auVar70,0xff);
    auVar33 = vbroadcastss_avx512vl(auVar36);
    auVar34 = vshufps_avx512vl(auVar36,auVar36,0x55);
    auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
    auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)fVar14));
    auVar33 = vmulps_avx512vl(auVar33,bezier_basis0._3740_16_);
    auVar34 = vmulps_avx512vl(auVar34,bezier_basis0._3740_16_);
    auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._3740_16_);
    auVar35 = vmulps_avx512vl(auVar35,bezier_basis0._3740_16_);
    auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._2584_16_,auVar85);
    auVar31 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2584_16_,auVar31);
    auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2584_16_,auVar32);
    auVar32 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2584_16_,auVar70);
    auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._1428_16_,auVar82);
    auVar37 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._1428_16_,auVar37);
    auVar70 = vfmadd231ps_fma(auVar36,bezier_basis0._1428_16_,auVar39);
    auVar38 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._1428_16_,auVar38);
    auVar36 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._272_16_,auVar76);
    auVar39 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._272_16_,auVar40);
    auVar37 = vfmadd231ps_fma(auVar70,bezier_basis0._272_16_,auVar41);
    auVar31 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._272_16_,auVar78);
    auVar32 = vshufps_avx512vl(auVar36,auVar36,0xb1);
    auVar38 = vminps_avx512vl(auVar32,auVar36);
    auVar70 = vshufpd_avx(auVar38,auVar38,1);
    auVar70 = vminps_avx(auVar70,auVar38);
    auVar33 = vshufps_avx512vl(auVar39,auVar39,0xb1);
    auVar40 = vminps_avx512vl(auVar33,auVar39);
    auVar38 = vshufpd_avx(auVar40,auVar40,1);
    auVar38 = vminps_avx(auVar38,auVar40);
    auVar70 = vinsertps_avx(auVar70,auVar38,0x1c);
    auVar41 = vshufps_avx(auVar37,auVar37,0xb1);
    auVar38 = vminps_avx(auVar41,auVar37);
    auVar40 = vshufpd_avx(auVar38,auVar38,1);
    auVar38 = vminps_avx(auVar40,auVar38);
    auVar70 = vinsertps_avx(auVar70,auVar38,0x20);
    auVar40 = vmaxps_avx512vl(auVar32,auVar36);
    auVar38 = vshufpd_avx(auVar40,auVar40,1);
    auVar38 = vmaxps_avx(auVar38,auVar40);
    auVar36 = vmaxps_avx512vl(auVar33,auVar39);
    auVar40 = vshufpd_avx(auVar36,auVar36,1);
    auVar40 = vmaxps_avx(auVar40,auVar36);
    auVar38 = vinsertps_avx(auVar38,auVar40,0x1c);
    auVar40 = vmaxps_avx(auVar41,auVar37);
    auVar41 = vshufpd_avx(auVar40,auVar40,1);
    auVar40 = vmaxps_avx(auVar41,auVar40);
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx512vl(auVar31,auVar16);
    auVar38 = vinsertps_avx(auVar38,auVar40,0x20);
    auVar40 = vprolq_avx512vl(auVar41,0x20);
    auVar40 = vmaxps_avx(auVar40,auVar41);
    uVar71 = auVar40._0_4_;
    auVar74._4_4_ = uVar71;
    auVar74._0_4_ = uVar71;
    auVar74._8_4_ = uVar71;
    auVar74._12_4_ = uVar71;
    auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
    auVar72 = vmaxps_avx(auVar40,auVar74);
  }
  else {
    if ((int)uVar5 < 1) {
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar61._8_4_ = 0xff800000;
      auVar61._0_8_ = 0xff800000ff800000;
      auVar61._12_4_ = 0xff800000;
      auVar61._16_4_ = 0xff800000;
      auVar61._20_4_ = 0xff800000;
      auVar61._24_4_ = 0xff800000;
      auVar61._28_4_ = 0xff800000;
      auVar62 = ZEXT832(0) << 0x40;
      auVar44 = auVar66;
      auVar46 = auVar66;
      auVar59 = auVar61;
      auVar60 = auVar61;
    }
    else {
      auVar43 = vpbroadcastd_avx512vl();
      auVar77._4_4_ = uVar71;
      auVar77._0_4_ = uVar71;
      auVar77._8_4_ = uVar71;
      auVar77._12_4_ = uVar71;
      auVar77._16_4_ = uVar71;
      auVar77._20_4_ = uVar71;
      auVar77._24_4_ = uVar71;
      auVar77._28_4_ = uVar71;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar37));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar47 = vpermps_avx512vl(auVar46,ZEXT1632(auVar37));
      auVar83._4_4_ = fVar13;
      auVar83._0_4_ = fVar13;
      auVar83._8_4_ = fVar13;
      auVar83._12_4_ = fVar13;
      auVar83._16_4_ = fVar13;
      auVar83._20_4_ = fVar13;
      auVar83._24_4_ = fVar13;
      auVar83._28_4_ = fVar13;
      auVar84._4_4_ = uVar79;
      auVar84._0_4_ = uVar79;
      auVar84._8_4_ = uVar79;
      auVar84._12_4_ = uVar79;
      auVar84._16_4_ = uVar79;
      auVar84._20_4_ = uVar79;
      auVar84._24_4_ = uVar79;
      auVar84._28_4_ = uVar79;
      auVar59 = ZEXT1632(auVar38);
      auVar48 = vpermps_avx512vl(auVar44,auVar59);
      auVar75._8_4_ = 3;
      auVar75._0_8_ = 0x300000003;
      auVar75._12_4_ = 3;
      auVar75._16_4_ = 3;
      auVar75._20_4_ = 3;
      auVar75._24_4_ = 3;
      auVar75._28_4_ = 3;
      auVar49 = vpermps_avx512vl(auVar46,auVar59);
      auVar65 = vpermps_avx2(auVar75,auVar59);
      auVar50 = vbroadcastss_avx512vl(auVar70);
      auVar59 = ZEXT1632(auVar70);
      auVar51 = vpermps_avx512vl(auVar44,auVar59);
      auVar52 = vpermps_avx512vl(auVar46,auVar59);
      auVar53 = vpermps_avx512vl(auVar75,auVar59);
      auVar54 = vbroadcastss_avx512vl(auVar36);
      auVar55 = vpermps_avx512vl(auVar44,ZEXT1632(auVar36));
      auVar56 = vpermps_avx512vl(auVar46,ZEXT1632(auVar36));
      auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)fVar14));
      lVar26 = uVar25 * 0x44;
      auVar64._8_4_ = 0xff800000;
      auVar64._0_8_ = 0xff800000ff800000;
      auVar64._12_4_ = 0xff800000;
      auVar64._16_4_ = 0xff800000;
      auVar64._20_4_ = 0xff800000;
      auVar64._24_4_ = 0xff800000;
      auVar64._28_4_ = 0xff800000;
      auVar81._8_4_ = 0x7f800000;
      auVar81._0_8_ = 0x7f8000007f800000;
      auVar81._12_4_ = 0x7f800000;
      auVar81._16_4_ = 0x7f800000;
      auVar81._20_4_ = 0x7f800000;
      auVar81._24_4_ = 0x7f800000;
      auVar81._28_4_ = 0x7f800000;
      auVar73 = ZEXT864(0) << 0x20;
      uVar27 = 0;
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = auVar64;
      auVar18 = auVar64;
      auVar19 = auVar81;
      auVar20 = auVar81;
      do {
        auVar44 = vpbroadcastd_avx512vl();
        auVar44 = vpord_avx512vl(auVar44,_DAT_0205a920);
        uVar15 = vpcmpgtd_avx512vl(auVar43,auVar44);
        auVar44 = *(undefined1 (*) [32])(lVar26 + 0x2227bec + uVar27 * 4);
        auVar46 = *(undefined1 (*) [32])(lVar26 + 0x2228070 + uVar27 * 4);
        auVar59 = vmulps_avx512vl(auVar54,auVar46);
        auVar60 = vmulps_avx512vl(auVar55,auVar46);
        auVar61 = vmulps_avx512vl(auVar56,auVar46);
        auVar46 = vmulps_avx512vl(auVar57,auVar46);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar44,auVar50);
        auVar60 = vfmadd231ps_avx512vl(auVar60,auVar44,auVar51);
        auVar61 = vfmadd231ps_avx512vl(auVar61,auVar44,auVar52);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar44);
        auVar44 = *(undefined1 (*) [32])(lVar26 + 0x2227768 + uVar27 * 4);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar44,auVar84);
        auVar60 = vfmadd231ps_avx512vl(auVar60,auVar44,auVar48);
        auVar61 = vfmadd231ps_avx512vl(auVar61,auVar44,auVar49);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar65,auVar44);
        auVar44 = *(undefined1 (*) [32])(bezier_basis0 + uVar27 * 4 + lVar26);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar44,auVar77);
        auVar60 = vfmadd231ps_avx512vl(auVar60,auVar44,auVar45);
        auVar62 = vfmadd231ps_avx512vl(auVar61,auVar44,auVar47);
        auVar63 = vfmadd231ps_avx512vl(auVar46,auVar83,auVar44);
        auVar44 = vminps_avx512vl(auVar19,auVar59);
        bVar10 = (byte)uVar15;
        auVar66._0_4_ =
             (uint)(bVar10 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar19._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar11 * auVar44._4_4_ | (uint)!bVar11 * auVar19._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar11 * auVar44._8_4_ | (uint)!bVar11 * auVar19._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar11 * auVar44._12_4_ | (uint)!bVar11 * auVar19._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar66._16_4_ = (uint)bVar11 * auVar44._16_4_ | (uint)!bVar11 * auVar19._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar66._20_4_ = (uint)bVar11 * auVar44._20_4_ | (uint)!bVar11 * auVar19._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar66._24_4_ = (uint)bVar11 * auVar44._24_4_ | (uint)!bVar11 * auVar19._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar66._28_4_ = (uint)bVar11 * auVar44._28_4_ | (uint)!bVar11 * auVar19._28_4_;
        auVar44 = vmaxps_avx512vl(auVar18,auVar59);
        auVar61._0_4_ =
             (uint)(bVar10 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar18._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar11 * auVar44._4_4_ | (uint)!bVar11 * auVar18._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar11 * auVar44._8_4_ | (uint)!bVar11 * auVar18._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar61._12_4_ = (uint)bVar11 * auVar44._12_4_ | (uint)!bVar11 * auVar18._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar61._16_4_ = (uint)bVar11 * auVar44._16_4_ | (uint)!bVar11 * auVar18._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar61._20_4_ = (uint)bVar11 * auVar44._20_4_ | (uint)!bVar11 * auVar18._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar61._24_4_ = (uint)bVar11 * auVar44._24_4_ | (uint)!bVar11 * auVar18._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar61._28_4_ = (uint)bVar11 * auVar44._28_4_ | (uint)!bVar11 * auVar18._28_4_;
        auVar46 = vminps_avx512vl(auVar20,auVar60);
        auVar44._0_4_ =
             (uint)(bVar10 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar20._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar20._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar20._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar20._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * auVar20._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * auVar20._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * auVar20._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar44._28_4_ = (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * auVar20._28_4_;
        auVar46 = vmaxps_avx512vl(auVar75,auVar60);
        auVar59._0_4_ =
             (uint)(bVar10 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar75._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar75._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar75._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar75._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar59._16_4_ = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * auVar75._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar59._20_4_ = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * auVar75._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar59._24_4_ = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * auVar75._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar59._28_4_ = (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * auVar75._28_4_;
        auVar60 = vminps_avx512vl(auVar81,auVar62);
        auVar46._0_4_ =
             (uint)(bVar10 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar81._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar11 * auVar60._4_4_ | (uint)!bVar11 * auVar81._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar11 * auVar60._8_4_ | (uint)!bVar11 * auVar81._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar11 * auVar60._12_4_ | (uint)!bVar11 * auVar81._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar11 * auVar60._16_4_ | (uint)!bVar11 * auVar81._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar11 * auVar60._20_4_ | (uint)!bVar11 * auVar81._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar11 * auVar60._24_4_ | (uint)!bVar11 * auVar81._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar46._28_4_ = (uint)bVar11 * auVar60._28_4_ | (uint)!bVar11 * auVar81._28_4_;
        auVar62 = vmaxps_avx512vl(auVar64,auVar62);
        auVar60._0_4_ =
             (uint)(bVar10 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar64._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar11 * auVar62._4_4_ | (uint)!bVar11 * auVar64._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar11 * auVar62._8_4_ | (uint)!bVar11 * auVar64._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar60._12_4_ = (uint)bVar11 * auVar62._12_4_ | (uint)!bVar11 * auVar64._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar60._16_4_ = (uint)bVar11 * auVar62._16_4_ | (uint)!bVar11 * auVar64._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar60._20_4_ = (uint)bVar11 * auVar62._20_4_ | (uint)!bVar11 * auVar64._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar60._24_4_ = (uint)bVar11 * auVar62._24_4_ | (uint)!bVar11 * auVar64._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar60._28_4_ = (uint)bVar11 * auVar62._28_4_ | (uint)!bVar11 * auVar64._28_4_;
        vandps_avx512vl(auVar63,auVar58);
        auVar64 = vmaxps_avx512vl(auVar73._0_32_,auVar60);
        auVar62._0_4_ =
             (uint)(bVar10 & 1) * auVar64._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar73._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar11 * auVar64._4_4_ | (uint)!bVar11 * auVar73._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar11 * auVar64._8_4_ | (uint)!bVar11 * auVar73._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar62._12_4_ = (uint)bVar11 * auVar64._12_4_ | (uint)!bVar11 * auVar73._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar62._16_4_ = (uint)bVar11 * auVar64._16_4_ | (uint)!bVar11 * auVar73._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar62._20_4_ = (uint)bVar11 * auVar64._20_4_ | (uint)!bVar11 * auVar73._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar62._24_4_ = (uint)bVar11 * auVar64._24_4_ | (uint)!bVar11 * auVar73._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar62._28_4_ = (uint)bVar11 * auVar64._28_4_ | (uint)!bVar11 * auVar73._28_4_;
        auVar73 = ZEXT3264(auVar62);
        uVar27 = uVar27 + 8;
        auVar64 = auVar60;
        auVar75 = auVar59;
        auVar18 = auVar61;
        auVar81 = auVar46;
        auVar19 = auVar66;
        auVar20 = auVar44;
      } while (uVar27 < uVar25);
    }
    auVar65 = vshufps_avx512vl(auVar66,auVar66,0xb1);
    auVar65 = vminps_avx512vl(auVar66,auVar65);
    auVar66 = vshufpd_avx(auVar65,auVar65,5);
    auVar66 = vminps_avx(auVar65,auVar66);
    auVar70 = vminps_avx(auVar66._0_16_,auVar66._16_16_);
    auVar66 = vshufps_avx512vl(auVar44,auVar44,0xb1);
    auVar66 = vminps_avx512vl(auVar44,auVar66);
    auVar44 = vshufpd_avx(auVar66,auVar66,5);
    auVar44 = vminps_avx(auVar66,auVar44);
    auVar38 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar38 = vunpcklps_avx(auVar70,auVar38);
    auVar44 = vshufps_avx(auVar46,auVar46,0xb1);
    auVar44 = vminps_avx(auVar46,auVar44);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vminps_avx(auVar44,auVar46);
    auVar70 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar70 = vinsertps_avx(auVar38,auVar70,0x28);
    auVar44 = vshufps_avx(auVar61,auVar61,0xb1);
    auVar44 = vmaxps_avx(auVar61,auVar44);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar38 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar44 = vshufps_avx(auVar59,auVar59,0xb1);
    auVar44 = vmaxps_avx(auVar59,auVar44);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar40 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar40 = vunpcklps_avx(auVar38,auVar40);
    auVar44 = vshufps_avx(auVar60,auVar60,0xb1);
    auVar44 = vmaxps_avx(auVar60,auVar44);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar38 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar38 = vinsertps_avx(auVar40,auVar38,0x28);
    auVar44 = vshufps_avx(auVar62,auVar62,0xb1);
    auVar44 = vmaxps_avx(auVar62,auVar44);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar40 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar72._0_4_ = auVar40._0_4_;
    auVar72._4_4_ = auVar72._0_4_;
    auVar72._8_4_ = auVar72._0_4_;
    auVar72._12_4_ = auVar72._0_4_;
  }
  auVar40 = vminps_avx(auVar70,auVar42);
  auVar70 = vmaxps_avx(auVar38,auVar42);
  auVar67._4_4_ = fVar14;
  auVar67._0_4_ = fVar14;
  auVar67._8_4_ = fVar14;
  auVar67._12_4_ = fVar14;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar42 = vandps_avx512vl(auVar67,auVar17);
  auVar42 = vmaxps_avx(auVar72,auVar42);
  auVar38 = vsubps_avx(auVar40,auVar42);
  auVar68._0_4_ = auVar70._0_4_ + auVar42._0_4_;
  auVar68._4_4_ = auVar70._4_4_ + auVar42._4_4_;
  auVar68._8_4_ = auVar70._8_4_ + auVar42._8_4_;
  auVar68._12_4_ = auVar70._12_4_ + auVar42._12_4_;
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  auVar70 = vandps_avx(auVar38,auVar69);
  auVar42 = vandps_avx(auVar68,auVar69);
  auVar70 = vmaxps_avx(auVar70,auVar42);
  auVar42 = vmovshdup_avx(auVar70);
  auVar42 = vmaxss_avx(auVar42,auVar70);
  auVar70 = vshufpd_avx(auVar70,auVar70,1);
  auVar70 = vmaxss_avx(auVar70,auVar42);
  fVar2 = auVar70._0_4_ * 4.7683716e-07;
  auVar70._4_4_ = fVar2;
  auVar70._0_4_ = fVar2;
  auVar70._8_4_ = fVar2;
  auVar70._12_4_ = fVar2;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar38,auVar70);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar68._0_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar68._4_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar68._8_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar68._12_4_ + fVar2;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }